

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O0

int32_t borg_object_value_known(borg_item *item)

{
  uint uVar1;
  object_kind *poVar2;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  ego_item *e_ptr;
  artifact *a_ptr;
  object_kind *k_ptr;
  int32_t value;
  borg_item *item_local;
  
  poVar2 = k_info;
  uVar1 = item->kind;
  if (k_info[uVar1].cost == L'\0') {
    return 0;
  }
  k_ptr._4_4_ = k_info[uVar1].cost;
  if (item->art_idx != '\0') {
    if (a_info[item->art_idx].cost == 0) {
      return 0;
    }
    k_ptr._4_4_ = a_info[item->art_idx].cost;
  }
  if (item->ego_idx != '\0') {
    if (e_info[item->ego_idx].cost == 0) {
      return 0;
    }
    k_ptr._4_4_ = e_info[item->ego_idx].cost + k_ptr._4_4_;
  }
  uVar4 = (uint)item->tval;
  if (uVar4 - 2 < 0x14) {
    if (item->pval < 0) {
      return 0;
    }
    if (item->pval != 0) {
      _Var3 = flag_has_dbg(item->flags,5,0,"item->flags","STAT_STR");
      if (_Var3) {
        k_ptr._4_4_ = k_ptr._4_4_ + item->pval * 200;
      }
      _Var3 = flag_has_dbg(item->flags,5,1,"item->flags","STAT_INT");
      if (_Var3) {
        k_ptr._4_4_ = k_ptr._4_4_ + item->pval * 200;
      }
      _Var3 = flag_has_dbg(item->flags,5,2,"item->flags","STAT_WIS");
      if (_Var3) {
        k_ptr._4_4_ = k_ptr._4_4_ + item->pval * 200;
      }
      _Var3 = flag_has_dbg(item->flags,5,3,"item->flags","STAT_DEX");
      if (_Var3) {
        k_ptr._4_4_ = k_ptr._4_4_ + item->pval * 200;
      }
      _Var3 = flag_has_dbg(item->flags,5,4,"item->flags","STAT_CON");
      if (_Var3) {
        k_ptr._4_4_ = k_ptr._4_4_ + item->pval * 200;
      }
      k_ptr._4_4_ = k_ptr._4_4_ + item->modifiers[5] * 100 + item->modifiers[6] * 100 +
                    item->modifiers[7] * 0x32 + item->modifiers[8] * 0x32;
      if (item->modifiers[10] != 0) {
        if (item->modifiers[10] < 6) {
          k_ptr._4_4_ = k_ptr._4_4_ + item->modifiers[10] * 2000;
        }
        else {
          k_ptr._4_4_ = k_ptr._4_4_ + 10000;
        }
      }
      k_ptr._4_4_ = k_ptr._4_4_ + item->modifiers[0xb] * 2000 + item->modifiers[9] * 30000 +
                    item->modifiers[0xd] * 100 + item->modifiers[0xc] * 100 +
                    item->modifiers[0xf] * 100 + item->modifiers[0xe] * 200;
    }
  }
  else if (uVar4 == 0x16 || uVar4 == 0x17) {
    k_ptr._4_4_ = (k_ptr._4_4_ / 0x14) * (int)item->pval + k_ptr._4_4_;
  }
  switch(item->tval) {
  case '\x02':
  case '\x03':
  case '\x04':
    if ((int)item->to_h + (int)item->to_d < 0) {
      return 0;
    }
    k_ptr._4_4_ = k_ptr._4_4_ + ((int)item->to_h + (int)item->to_d) * 5;
    if ((poVar2[uVar1].dd < (int)(uint)item->dd) && ((uint)item->ds == poVar2[uVar1].ds)) {
      k_ptr._4_4_ = k_ptr._4_4_ + ((uint)item->dd - poVar2[uVar1].dd) * (uint)item->ds * 5;
    }
    break;
  case '\x05':
  case '\x06':
  case '\a':
  case '\b':
  case '\t':
    if ((int)item->to_h + (int)item->to_d < 0) {
      return 0;
    }
    k_ptr._4_4_ = k_ptr._4_4_ + ((int)item->to_h + (int)item->to_d + (int)item->to_a) * 100;
    if ((poVar2[uVar1].dd < (int)(uint)item->dd) && ((uint)item->ds == poVar2[uVar1].ds)) {
      k_ptr._4_4_ = k_ptr._4_4_ + ((uint)item->dd - poVar2[uVar1].dd) * (uint)item->ds * 200;
    }
    break;
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
    if (item->to_a < 0) {
      return 0;
    }
    if ((item->to_h < 0) && (-5 < item->to_h)) {
      iVar5 = (int)item->to_d + (int)item->to_a;
    }
    else {
      iVar5 = (int)item->to_h + (int)item->to_d + (int)item->to_a;
    }
    k_ptr._4_4_ = k_ptr._4_4_ + iVar5 * 100;
    break;
  case '\x15':
    if ((uint)item->sval == sv_ring_dog) {
      return 0;
    }
  case '\x14':
    if (item->to_a < 0) {
      return 0;
    }
    if (item->to_h < 0) {
      return 0;
    }
    if (item->to_d < 0) {
      return 0;
    }
    k_ptr._4_4_ = k_ptr._4_4_ + ((int)item->to_h + (int)item->to_d + (int)item->to_a) * 100;
  }
  return k_ptr._4_4_;
}

Assistant:

static int32_t borg_object_value_known(borg_item* item)
{
    int32_t             value;

    struct object_kind* k_ptr = &k_info[item->kind];

    /* Worthless items */
    if (!k_ptr->cost)
        return (0L);

    /* Extract the base value */
    value = k_ptr->cost;

    /* Hack -- use artifact base costs */
    if (item->art_idx) {
        struct artifact* a_ptr = &a_info[item->art_idx];

        /* Worthless artifacts */
        if (!a_ptr->cost)
            return (0L);

        /* Hack -- use the artifact cost */
        value = a_ptr->cost;
    }

    /* Hack -- add in ego-item bonus cost */
    if (item->ego_idx) {
        struct ego_item* e_ptr = &e_info[item->ego_idx];

        /* Worthless ego-items */
        if (!e_ptr->cost)
            return (0L);

        /* Hack -- reward the ego-item cost */
        value += e_ptr->cost;
    }

    /* Analyze pval bonus */
    switch (item->tval) {
        /* Wands/Staffs */
    case TV_WAND:
    case TV_STAFF: {
        /* Pay extra for charges */
        value += ((value / 20) * item->pval);

        break;
    }

    /* Wearable items */
    case TV_SHOT:
    case TV_ARROW:
    case TV_BOLT:
    case TV_BOW:
    case TV_DIGGING:
    case TV_HAFTED:
    case TV_POLEARM:
    case TV_SWORD:
    case TV_BOOTS:
    case TV_GLOVES:
    case TV_HELM:
    case TV_CROWN:
    case TV_SHIELD:
    case TV_CLOAK:
    case TV_SOFT_ARMOR:
    case TV_HARD_ARMOR:
    case TV_DRAG_ARMOR:
    case TV_LIGHT:
    case TV_AMULET:
    case TV_RING: {
        /* Hack -- Negative "pval" is always bad */
        if (item->pval < 0)
            return (0L);

        /* No pval */
        if (!item->pval)
            break;

        /* Give credit for stat bonuses */
        if (of_has(item->flags, STAT_STR))
            value += (item->pval * 200L);
        if (of_has(item->flags, STAT_INT))
            value += (item->pval * 200L);
        if (of_has(item->flags, STAT_WIS))
            value += (item->pval * 200L);
        if (of_has(item->flags, STAT_DEX))
            value += (item->pval * 200L);
        if (of_has(item->flags, STAT_CON))
            value += (item->pval * 200L);

        /* Give credit for stealth and searching */
        value += (item->modifiers[OBJ_MOD_STEALTH] * 100L);
        value += (item->modifiers[OBJ_MOD_SEARCH] * 100L);

        /* Give credit for infra-vision and tunneling */
        value += (item->modifiers[OBJ_MOD_INFRA] * 50L);
        value += (item->modifiers[OBJ_MOD_TUNNEL] * 50L);

        /* Give credit for extra attacks */
        if (item->modifiers[OBJ_MOD_BLOWS]) {
            if (item->modifiers[OBJ_MOD_BLOWS] > MAX_BLOWS) {
                value += (MAX_BLOWS * 2000L);
            } else {
                value += (item->modifiers[OBJ_MOD_BLOWS] * 2000L);
            }
        }
        value += (item->modifiers[OBJ_MOD_SHOTS] * 2000L);

        /* Give credit for speed bonus */
        value += (item->modifiers[OBJ_MOD_SPEED] * 30000L);

        /* Give credit for glowing bonus */
        value += (item->modifiers[OBJ_MOD_LIGHT] * 100L);

        /* Give credit for might */
        value += (item->modifiers[OBJ_MOD_MIGHT] * 100L);

        /* Give credit for moves */
        value += (item->modifiers[OBJ_MOD_MOVES] * 100L);

        /* Give credit for damage reduction */
        value += (item->modifiers[OBJ_MOD_DAM_RED] * 200L);

        break;
    }
    }

    /* Analyze the item */
    switch (item->tval) {
        /* Rings/Amulets */
    case TV_RING:
        /* HACK special case */
        if (item->sval == sv_ring_dog)
            return (0L);

        /* Fall through */
    case TV_AMULET: {
        /* Hack -- negative bonuses are bad */
        if (item->to_a < 0)
            return (0L);
        if (item->to_h < 0)
            return (0L);
        if (item->to_d < 0)
            return (0L);

        /* Give credit for bonuses */
        value += ((item->to_h + item->to_d + item->to_a) * 100L);

        break;
    }

    /* Armor */
    case TV_BOOTS:
    case TV_GLOVES:
    case TV_CLOAK:
    case TV_CROWN:
    case TV_HELM:
    case TV_SHIELD:
    case TV_SOFT_ARMOR:
    case TV_HARD_ARMOR:
    case TV_DRAG_ARMOR: {
        /* Hack -- negative armor bonus */
        if (item->to_a < 0)
            return (0L);

        /* Give credit for bonuses */
        /* ignore low to_hit on armor for now since the base armor is marked */
        /* and that should be built into the value */
        if (item->to_h < 0 && item->to_h > -5)
            value += ((item->to_d + item->to_a) * 100L);
        else
            value += ((item->to_h + item->to_d + item->to_a) * 100L);

        break;
    }

    /* Bows/Weapons */
    case TV_BOW:
    case TV_DIGGING:
    case TV_HAFTED:
    case TV_SWORD:
    case TV_POLEARM: {
        /* Hack -- negative hit/damage bonuses */
        if (item->to_h + item->to_d < 0)
            return (0L);

        /* Factor in the bonuses */
        value += ((item->to_h + item->to_d + item->to_a) * 100L);

        /* Hack -- Factor in extra damage dice */
        if ((item->dd > k_ptr->dd) && (item->ds == k_ptr->ds)) {
            value += (item->dd - k_ptr->dd) * item->ds * 200L;
        }

        break;
    }

    /* Ammo */
    case TV_SHOT:
    case TV_ARROW:
    case TV_BOLT: {
        /* Hack -- negative hit/damage bonuses */
        if (item->to_h + item->to_d < 0)
            return (0L);

        /* Factor in the bonuses */
        value += ((item->to_h + item->to_d) * 5L);

        /* Hack -- Factor in extra damage dice */
        if ((item->dd > k_ptr->dd) && (item->ds == k_ptr->ds)) {
            value += (item->dd - k_ptr->dd) * item->ds * 5L;
        }

        break;
    }
    }

    /* Return the value */
    return (value);
}